

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O0

void __thiscall
bas::Vector<float2,4ul,bas::RawAllocator>::init_copy_from_other_vector<4ul>
          (Vector<float2,4ul,bas::RawAllocator> *this,Vector<float2,_4UL,_bas::RawAllocator> *other)

{
  size_t sVar1;
  float2 *pfVar2;
  void *pvVar3;
  float2 *__last;
  size_t local_28;
  size_t capacity;
  size_t size;
  Vector<float2,_4UL,_bas::RawAllocator> *other_local;
  Vector<float2,_4UL,_bas::RawAllocator> *this_local;
  
  sVar1 = Vector<float2,_4UL,_bas::RawAllocator>::size(other);
  if (sVar1 < 5) {
    pfVar2 = Vector<float2,_4UL,_bas::RawAllocator>::small_buffer
                       ((Vector<float2,_4UL,_bas::RawAllocator> *)this);
    *(float2 **)this = pfVar2;
    local_28 = 4;
  }
  else {
    pvVar3 = RawAllocator::allocate((RawAllocator *)(this + 0x18),sVar1 << 3,4);
    *(void **)this = pvVar3;
    local_28 = sVar1;
  }
  *(size_t *)(this + 8) = *(long *)this + sVar1 * 8;
  *(size_t *)(this + 0x10) = *(long *)this + local_28 * 8;
  pfVar2 = Vector<float2,_4UL,_bas::RawAllocator>::begin(other);
  __last = Vector<float2,_4UL,_bas::RawAllocator>::end(other);
  std::uninitialized_copy<float2_const*,float2*>(pfVar2,__last,*(float2 **)this);
  *(long *)(this + 0x40) = *(long *)(this + 8) - *(long *)this >> 3;
  return;
}

Assistant:

void init_copy_from_other_vector(const Vector<T, OtherN, Allocator> &other)
    {
        m_allocator = other.m_allocator;

        size_t size = other.size();
        size_t capacity = size;

        if (size <= N) {
            m_begin = this->small_buffer();
            capacity = N;
        }
        else {
            m_begin = (T *)m_allocator.allocate(sizeof(T) * size,
                                                std::alignment_of<T>::value);
            capacity = size;
        }

        m_end = m_begin + size;
        m_capacity_end = m_begin + capacity;

        uninitialized_copy(other.begin(), other.end(), m_begin);
        UPDATE_VECTOR_SIZE(this);
    }